

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Marray<int,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::operator=
          (Marray<int,std::allocator<unsigned_long>> *this,
          View<int,_false,_std::allocator<unsigned_long>_> *in)

{
  reference piVar1;
  size_t *psVar2;
  size_t *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  reference piVar8;
  reference piVar9;
  int *piVar10;
  unsigned_long *__dest;
  reference piVar11;
  size_t sVar12;
  reference piVar13;
  runtime_error *this_00;
  ulong uVar14;
  void *dataPointer_;
  void *vDataPointer_;
  Marray<int,_std::allocator<unsigned_long>_> m;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_70;
  long local_40;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
  if ((View<int,_false,_std::allocator<unsigned_long>_> *)this != in) {
    if (in->data_ == (pointer)0x0) {
      operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
      *(undefined8 *)this = 0;
      sVar12 = (in->geometry_).dimension_;
      __dest = *(unsigned_long **)(this + 0x10);
      if (sVar12 != *(size_t *)(this + 0x28)) {
        operator_delete(__dest,*(size_t *)(this + 0x28) * 0x18);
        sVar12 = (in->geometry_).dimension_;
        *(size_t *)(this + 0x28) = sVar12;
        __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                           ((new_allocator<unsigned_long> *)(this + 8),sVar12 * 3,(void *)0x0);
        *(unsigned_long **)(this + 0x10) = __dest;
        *(unsigned_long **)(this + 0x18) = __dest + *(long *)(this + 0x28);
        *(unsigned_long **)(this + 0x20) = __dest + *(long *)(this + 0x28) + *(long *)(this + 0x28);
        sVar12 = (in->geometry_).dimension_;
        *(size_t *)(this + 0x28) = sVar12;
      }
      memcpy(__dest,(in->geometry_).shape_,sVar12 * 0x18);
      *(size_t *)(this + 0x30) = (in->geometry_).size_;
      *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
      this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)(in->geometry_).isSimple_;
    }
    else {
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
      View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
      piVar11 = *(reference *)this;
      if ((piVar11 == (reference)0x0) || (piVar1 = in->data_, piVar1 == (reference)0x0)) {
LAB_002359c9:
        if (*(size_t *)(this + 0x30) != (in->geometry_).size_) {
          operator_delete(*(void **)this,*(size_t *)(this + 0x30) << 2);
          piVar10 = __gnu_cxx::new_allocator<int>::allocate
                              ((new_allocator<int> *)(this + 0x40),(in->geometry_).size_,(void *)0x0
                              );
          *(int **)this = piVar10;
        }
        if (in->data_ == (pointer)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_00235f1b;
        }
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
                  ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),(in->geometry_).dimension_
                  );
        if (in->data_ == (pointer)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_00235f1b;
        }
        if ((in->geometry_).dimension_ != 0) {
          psVar2 = (in->geometry_).shape_;
          psVar3 = (in->geometry_).shapeStrides_;
          lVar4 = *(long *)(this + 0x10);
          lVar5 = *(long *)(this + 0x18);
          lVar6 = *(long *)(this + 0x20);
          uVar14 = 0;
          do {
            if (*(ulong *)(this + 0x28) <= uVar14) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
              goto LAB_00235f1b;
            }
            *(size_t *)(lVar4 + uVar14 * 8) = psVar2[uVar14];
            if ((in->geometry_).dimension_ <= uVar14) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
              goto LAB_00235f1b;
            }
            if (*(ulong *)(this + 0x28) <= uVar14) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
              goto LAB_00235f1b;
            }
            sVar12 = psVar3[uVar14];
            *(size_t *)(lVar5 + uVar14 * 8) = sVar12;
            if ((in->geometry_).dimension_ <= uVar14) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
              goto LAB_00235f1b;
            }
            if (*(ulong *)(this + 0x28) <= uVar14) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
              goto LAB_00235f1b;
            }
            *(size_t *)(lVar6 + uVar14 * 8) = sVar12;
            uVar14 = uVar14 + 1;
          } while (uVar14 < (in->geometry_).dimension_);
        }
        *(size_t *)(this + 0x30) = (in->geometry_).size_;
        this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
        View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
        *(CoordinateOrder *)(this + 0x38) = (in->geometry_).coordinateOrder_;
        View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
        if ((in->geometry_).isSimple_ == false) {
          if (in->data_ == (pointer)0x0) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_00235f1b;
          }
          sVar12 = (in->geometry_).dimension_;
          if (sVar12 == 3) {
            uVar7 = *(undefined8 *)this;
            local_70.view_._0_4_ = 0;
            piVar11 = marray_detail::AccessOperatorHelper<true>::
                      execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
            marray_detail::
            OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(this,in,uVar7,piVar11);
          }
          else if (sVar12 == 2) {
            uVar7 = *(undefined8 *)this;
            local_70.view_._0_4_ = 0;
            piVar11 = marray_detail::AccessOperatorHelper<true>::
                      execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
            marray_detail::
            OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operate(this,in,uVar7,piVar11);
          }
          else if (sVar12 == 1) {
            piVar10 = *(int **)this;
            local_70.view_._0_4_ = 0;
            piVar11 = marray_detail::AccessOperatorHelper<true>::
                      execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
            sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                               ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
            if (sVar12 != 0) {
              uVar14 = 0;
              do {
                *piVar10 = *piVar11;
                sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
                piVar10 = piVar10 + sVar12;
                sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::strides(in,0);
                piVar11 = piVar11 + sVar12;
                uVar14 = uVar14 + 1;
                sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
              } while (uVar14 < sVar12);
            }
            View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
            View<int,_false,_std::allocator<unsigned_long>_>::strides
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
            View<int,_false,_std::allocator<unsigned_long>_>::shape(in,0);
            View<int,_false,_std::allocator<unsigned_long>_>::strides(in,0);
          }
          else {
            sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
            if (sVar12 == 4) {
              uVar7 = *(undefined8 *)this;
              local_70.view_._0_4_ = 0;
              piVar11 = marray_detail::AccessOperatorHelper<true>::
                        execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
              marray_detail::
              OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(this,in,uVar7,piVar11);
            }
            else {
              sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
              if (sVar12 == 5) {
                uVar7 = *(undefined8 *)this;
                local_70.view_._0_4_ = 0;
                piVar11 = marray_detail::AccessOperatorHelper<true>::
                          execute<int,int,false,std::allocator<unsigned_long>>(in,(int *)&local_70);
                marray_detail::
                OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(this,in,uVar7,piVar11);
              }
              else {
                sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                if (sVar12 == 6) {
                  uVar7 = *(undefined8 *)this;
                  local_70.view_._0_4_ = 0;
                  piVar11 = marray_detail::AccessOperatorHelper<true>::
                            execute<int,int,false,std::allocator<unsigned_long>>
                                      (in,(int *)&local_70);
                  marray_detail::
                  OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(this,in,uVar7,piVar11);
                }
                else {
                  sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                  if (sVar12 == 7) {
                    uVar7 = *(undefined8 *)this;
                    local_70.view_._0_4_ = 0;
                    piVar11 = marray_detail::AccessOperatorHelper<true>::
                              execute<int,int,false,std::allocator<unsigned_long>>
                                        (in,(int *)&local_70);
                    marray_detail::
                    OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(this,in,uVar7,piVar11);
                  }
                  else {
                    sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                    if (sVar12 == 8) {
                      uVar7 = *(undefined8 *)this;
                      local_70.view_._0_4_ = 0;
                      piVar11 = marray_detail::AccessOperatorHelper<true>::
                                execute<int,int,false,std::allocator<unsigned_long>>
                                          (in,(int *)&local_70);
                      marray_detail::
                      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(this,in,uVar7,piVar11);
                    }
                    else {
                      sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                      if (sVar12 == 9) {
                        uVar7 = *(undefined8 *)this;
                        local_70.view_._0_4_ = 0;
                        piVar11 = marray_detail::AccessOperatorHelper<true>::
                                  execute<int,int,false,std::allocator<unsigned_long>>
                                            (in,(int *)&local_70);
                        marray_detail::
                        OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(this,in,uVar7,piVar11);
                      }
                      else {
                        sVar12 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
                        if (sVar12 == 10) {
                          uVar7 = *(undefined8 *)this;
                          local_70.view_._0_4_ = 0;
                          piVar11 = marray_detail::AccessOperatorHelper<true>::
                                    execute<int,int,false,std::allocator<unsigned_long>>
                                              (in,(int *)&local_70);
                          marray_detail::
                          OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(this,in,uVar7,piVar11);
                        }
                        else {
                          View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
                          Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_70,in,0);
                          for (uVar14 = 0; uVar14 < *(ulong *)(this + 0x30); uVar14 = uVar14 + 1) {
                            piVar13 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                                                (&local_70);
                            *(int *)(*(long *)this + uVar14 * 4) = *piVar13;
                            Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                      (&local_70);
                          }
                          if (local_70.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            uVar14 = (long)local_70.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)local_70.coordinates_.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                            local_70.index_ =
                                 (size_t)local_70.coordinates_.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                            goto LAB_002359bf;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          memcpy(*(void **)this,in->data_,(in->geometry_).size_ << 2);
        }
      }
      else {
        piVar8 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                           ((View<int,_false,_std::allocator<unsigned_long>_> *)this,
                            *(long *)(this + 0x30) - 1);
        piVar9 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                           (in,(in->geometry_).size_ - 1);
        if (((piVar1 < piVar11) || (piVar8 < piVar1)) && ((piVar11 < piVar1 || (piVar9 < piVar11))))
        goto LAB_002359c9;
        Marray<int,false,std::allocator<unsigned_long>>
                  ((Marray<int,std::allocator<unsigned_long>> *)&local_70,in);
        Marray<int,_std::allocator<unsigned_long>_>::operator=
                  ((Marray<int,_std::allocator<unsigned_long>_> *)this,
                   (Marray<int,_std::allocator<unsigned_long>_> *)&local_70);
        operator_delete((void *)CONCAT44(local_70.view_._4_4_,local_70.view_._0_4_),local_40 << 2);
        uVar14 = (long)local_70.coordinates_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * 0x18;
LAB_002359bf:
        operator_delete((void *)local_70.index_,uVar14);
      }
    }
  }
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<int,std::allocator<unsigned_long>>)0x0) {
    return (Marray<int,_std::allocator<unsigned_long>_> *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00235f1b:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Marray<T, A>&
Marray<T, A>::operator=
(
    const View<TLocal, isConstLocal, ALocal>& in
)
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }
    if( (void*)(this) != (void*)(&in) ) { // no self-assignment
        if(in.data_ == 0) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = 0;
            this->geometry_ = in.geometry_;
        }
        else if(this->overlaps(in)) {
            Marray<T, A> m = in; // temporary copy
            (*this) = m;
        }
        else {
            // re-alloc memory if necessary
            if(this->size() != in.size()) {
                dataAllocator_.deallocate(this->data_, this->size());
                this->data_ = dataAllocator_.allocate(in.size());
            }

            // copy geometry
            this->geometry_.resize(in.dimension());
            for(std::size_t j=0; j<in.dimension(); ++j) {
                this->geometry_.shape(j) = in.geometry_.shape(j);
                this->geometry_.shapeStrides(j) = in.geometry_.shapeStrides(j);
                this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
            }
            this->geometry_.size() = in.size();
            this->geometry_.isSimple() = true;
            this->geometry_.coordinateOrder() = in.coordinateOrder();

            // copy data
            if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
                memcpy(this->data_, in.data_, (in.size())*sizeof(T));
            }
            else if(in.dimension() == 1)
                marray_detail::OperateHelperBinary<1, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 2)
                marray_detail::OperateHelperBinary<2, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 3)
                marray_detail::OperateHelperBinary<3, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 4)
                marray_detail::OperateHelperBinary<4, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 5)
                marray_detail::OperateHelperBinary<5, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 6)
                marray_detail::OperateHelperBinary<6, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 7)
                marray_detail::OperateHelperBinary<7, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 8)
                marray_detail::OperateHelperBinary<8, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 9)
                marray_detail::OperateHelperBinary<9, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else if(in.dimension() == 10)
                marray_detail::OperateHelperBinary<10, marray_detail::Assign<T, TLocal>, T, TLocal, isConstLocal, A, ALocal>::operate(*this, in, marray_detail::Assign<T, TLocal>(), this->data_, &in(0));
            else {
                typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
                for(std::size_t j=0; j<this->size(); ++j, ++it) {
                    this->data_[j] = static_cast<T>(*it);
                }
            }
        }
    }
    testInvariant();
    return *this;
}